

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipc.c
# Opt level: O1

void ipc_ep_fini(void *arg)

{
  nni_aio_fini((nni_aio *)((long)arg + 0x228));
  nni_aio_fini((nni_aio *)((long)arg + 0x60));
  nng_stream_dialer_free(*(nng_stream_dialer **)((long)arg + 0x38));
  nng_stream_listener_free(*(nng_stream_listener **)((long)arg + 0x40));
  nni_mtx_fini((nni_mtx *)arg);
  return;
}

Assistant:

static void
ipc_ep_fini(void *arg)
{
	ipc_ep *ep = arg;

	nni_aio_fini(&ep->time_aio);
	nni_aio_fini(&ep->conn_aio);
	nng_stream_dialer_free(ep->dialer);
	nng_stream_listener_free(ep->listener);
	nni_mtx_fini(&ep->mtx);
}